

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileSwitch(jx9_gen_state *pGen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  sxi32 sVar4;
  sxu32 nFirstInstr;
  sxu32 sVar5;
  SySet *pSet;
  bool bVar6;
  undefined1 local_78 [8];
  jx9_case_expr sCase;
  sxu32 nKwrd;
  sxi32 rc;
  sxu32 nLine;
  jx9_switch *pSwitch;
  SyToken *pEnd;
  SyToken *pTmp;
  GenBlock *pSwitchBlock;
  jx9_gen_state *pGen_local;
  
  sVar5 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pSwitchBlock = (GenBlock *)pGen;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x200) != 0)) {
    pGen->pIn = pGen->pIn + 1;
    pSwitch = (jx9_switch *)0x0;
    nFirstInstr = jx9VmInstrLength(pGen->pVm);
    sVar4 = GenStateEnterBlock(pGen,0x101,nFirstInstr,(void *)0x0,(GenBlock **)&pTmp);
    if (sVar4 != 0) {
      return -10;
    }
    jx9DelimitNestedTokens
              (*(SyToken **)&pSwitchBlock[2].aPostContFix.eSize,
               (SyToken *)pSwitchBlock[2].aPostContFix.pUserData,0x200,0x400,(SyToken **)&pSwitch);
    if (((*(jx9_switch **)&pSwitchBlock[2].aPostContFix.eSize == pSwitch) ||
        ((jx9_switch *)pSwitchBlock[2].aPostContFix.pUserData <= pSwitch)) &&
       (sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,1,sVar5,
                                   "Expected expression after \'switch\' keyword"), sVar4 == -10)) {
      return -10;
    }
    pEnd = (SyToken *)pSwitchBlock[2].aPostContFix.pUserData;
    pSwitchBlock[2].aPostContFix.pUserData = pSwitch;
    sVar4 = jx9CompileExpr((jx9_gen_state *)pSwitchBlock,0,
                           (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar4 == -10) {
      return -10;
    }
    while (*(jx9_switch **)&pSwitchBlock[2].aPostContFix.eSize < pSwitch) {
      uVar1._0_4_ = pSwitchBlock[2].aPostContFix.eSize;
      uVar1._4_4_ = pSwitchBlock[2].aPostContFix.nCursor;
      sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,1,
                                 *(sxu32 *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x14),
                                 "Switch: Unexpected token \'%z\'",uVar1);
      if (sVar4 == -10) {
        return -10;
      }
      *(long *)&pSwitchBlock[2].aPostContFix.eSize =
           *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
    }
    *(void ***)&pSwitchBlock[2].aPostContFix.eSize = &(pSwitch->aCaseExpr).pUserData;
    pSwitchBlock[2].aPostContFix.pUserData = pEnd;
    if (((*(void **)&pSwitchBlock[2].aPostContFix.eSize < pSwitchBlock[2].aPostContFix.pUserData) &&
        ((void *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20U) <
         pSwitchBlock[2].aPostContFix.pUserData)) &&
       ((*(uint *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x10) & 0x100040) != 0)) {
      *(long *)&pSwitchBlock[2].aPostContFix.eSize =
           *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
      pSet = (SySet *)SyMemBackendAlloc((SyMemBackend *)pSwitchBlock->pGen,0x30);
      if (pSet == (SySet *)0x0) {
        sVar4 = GenStateOutOfMem((jx9_gen_state *)pSwitchBlock);
        return sVar4;
      }
      SyZero(pSet,0x30);
      SySetInit(pSet,(SyMemBackend *)pSwitchBlock->pGen,0x30);
      jx9VmEmitInstr((jx9_vm *)pSwitchBlock->pGen,0x45,0,0,pSet,(sxu32 *)0x0);
      do {
        while( true ) {
          if (pSwitchBlock[2].aPostContFix.pUserData <=
              *(void **)&pSwitchBlock[2].aPostContFix.eSize) goto LAB_001391ac;
          if ((*(uint *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x10) & 4) == 0) {
            if (((*(uint *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x10) & 0x80) == 0) &&
               (uVar2._0_4_ = pSwitchBlock[2].aPostContFix.eSize,
               uVar2._4_4_ = pSwitchBlock[2].aPostContFix.nCursor,
               sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,1,
                                          *(sxu32 *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize +
                                                    0x14),"Switch: Unexpected token \'%z\'",uVar2),
               sVar4 == -10)) {
              return -10;
            }
            goto LAB_001391ac;
          }
          sCase._44_4_ = SUB84(*(undefined8 *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x18),
                               0);
          if (sCase._44_4_ != 10) break;
          if ((*(int *)((long)&pSet[1].pAllocator + 4) != 0) &&
             (sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,2,
                                         *(sxu32 *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize +
                                                   0x14),"Switch: \'default\' case already compiled"
                                        ), sVar4 == -10)) {
            return -10;
          }
          *(long *)&pSwitchBlock[2].aPostContFix.eSize =
               *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
          sVar4 = GenStateCompileSwitchBlock
                            ((jx9_gen_state *)pSwitchBlock,(sxu32 *)((long)&pSet[1].pAllocator + 4))
          ;
          if (sVar4 == -10) {
            return -10;
          }
          if (sVar4 == -0x12) goto LAB_001391ac;
        }
        if (sCase._44_4_ != 5) {
          uVar3._0_4_ = pSwitchBlock[2].aPostContFix.eSize;
          uVar3._4_4_ = pSwitchBlock[2].aPostContFix.nCursor;
          sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,1,
                                     *(sxu32 *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x14)
                                     ,"Switch: Unexpected token \'%z\'",uVar3);
          if (sVar4 == -10) {
            return -10;
          }
          break;
        }
        *(long *)&pSwitchBlock[2].aPostContFix.eSize =
             *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
        SySetInit((SySet *)local_78,(SyMemBackend *)pSwitchBlock->pGen,0x18);
        sVar4 = GenStateCompileCaseExpr((jx9_gen_state *)pSwitchBlock,(jx9_case_expr *)local_78);
        if (sVar4 == -10) {
          return -10;
        }
        sVar4 = GenStateCompileSwitchBlock
                          ((jx9_gen_state *)pSwitchBlock,(sxu32 *)&sCase.aByteCode.pUserData);
        SySetPut(pSet,local_78);
        if (sVar4 == -10) {
          return -10;
        }
      } while (sVar4 != -0x12);
LAB_001391ac:
      sVar5 = jx9VmInstrLength((jx9_vm *)pSwitchBlock->pGen);
      *(sxu32 *)&pSet[1].pAllocator = sVar5;
      sVar5 = jx9VmInstrLength((jx9_vm *)pSwitchBlock->pGen);
      GenStateFixJumps((GenBlock *)pTmp,-1,sVar5);
      GenStateLeaveBlock((jx9_gen_state *)pSwitchBlock,(GenBlock **)0x0);
      if (*(void **)&pSwitchBlock[2].aPostContFix.eSize < pSwitchBlock[2].aPostContFix.pUserData) {
        *(long *)&pSwitchBlock[2].aPostContFix.eSize =
             *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
      }
      return 0;
    }
    pEnd = *(SyToken **)&pSwitchBlock[2].aPostContFix.eSize;
    if ((SyToken *)pSwitchBlock[2].aPostContFix.pUserData <= pEnd) {
      pEnd = pEnd + -1;
    }
    sVar4 = jx9GenCompileError((jx9_gen_state *)pSwitchBlock,1,pEnd->nLine,
                               "Switch: Unexpected token \'%z\'",pEnd);
    if (sVar4 == -10) {
      return -10;
    }
  }
  else {
    sVar4 = jx9GenCompileError(pGen,1,sVar5,"Expected \'(\' after \'switch\' keyword");
    if (sVar4 == -10) {
      return -10;
    }
  }
  while( true ) {
    bVar6 = false;
    if (*(void **)&pSwitchBlock[2].aPostContFix.eSize < pSwitchBlock[2].aPostContFix.pUserData) {
      bVar6 = (*(uint *)(*(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x10) & 0x40000) == 0;
    }
    if (!bVar6) break;
    *(long *)&pSwitchBlock[2].aPostContFix.eSize =
         *(long *)&pSwitchBlock[2].aPostContFix.eSize + 0x20;
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileSwitch(jx9_gen_state *pGen)
{
	GenBlock *pSwitchBlock;
	SyToken *pTmp, *pEnd;
	jx9_switch *pSwitch;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'switch' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	pEnd = 0; /* cc warning */
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP|GEN_BLOCK_SWITCH, 
		jx9VmInstrLength(pGen->pVm), 0, &pSwitchBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'switch' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"Switch: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	if( pGen->pIn >= pGen->pEnd || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_COLON/*:*/)) == 0 ){
			pTmp = pGen->pIn;
			if( pTmp >= pGen->pEnd ){
				pTmp--;
			}
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pTmp->nLine, "Switch: Unexpected token '%z'", &pTmp->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++; /* Jump the leading curly braces/colons */
	/* Create the switch blocks container */
	pSwitch = (jx9_switch *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_switch));
	if( pSwitch == 0 ){
		/* Abort compilation */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pSwitch, sizeof(jx9_switch));
	/* Initialize fields */
	SySetInit(&pSwitch->aCaseExpr, &pGen->pVm->sAllocator, sizeof(jx9_case_expr));
	/* Emit the switch instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_SWITCH, 0, 0, pSwitch, 0);
	/* Compile case blocks */
	for(;;){
		sxu32 nKwrd;
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if(  (pGen->pIn->nType & JX9_TK_CCB /*}*/) == 0 ){
				/* Unexpected token */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				/* FALL THROUGH */
			}
			/* Block compiled */
			break;
		}
		/* Extract the keyword */
		nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( nKwrd == JX9_TKWRD_DEFAULT ){
			/*
			 * Accroding to the JX9 language reference manual
			 *  A special case is the default case. This case matches anything
			 *  that wasn't matched by the other cases.
			 */
			if( pSwitch->nDefault > 0 ){
				/* Default case already compiled */ 
				rc = jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Switch: 'default' case already compiled");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
			}
			pGen->pIn++; /* Jump the 'default' keyword */
			/* Compile the default block */
			rc = GenStateCompileSwitchBlock(pGen,&pSwitch->nDefault);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else if( nKwrd == JX9_TKWRD_CASE ){
			jx9_case_expr sCase;
			/* Standard case block */
			pGen->pIn++; /* Jump the 'case' keyword */
			/* initialize the structure */
			SySetInit(&sCase.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
			/* Compile the case expression */
			rc = GenStateCompileCaseExpr(pGen, &sCase);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			/* Compile the case block */
			rc = GenStateCompileSwitchBlock(pGen,&sCase.nStart);
			/* Insert in the switch container */
			SySetPut(&pSwitch->aCaseExpr, (const void *)&sCase);
			if( rc == SXERR_ABORT){
				return SXERR_ABORT;
			}else if( rc == SXERR_EOF ){
				break;
			}
		}else{
			/* Unexpected token */
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Switch: Unexpected token '%z'", 
				&pGen->pIn->sData);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
	}
	/* Fix all jumps now the destination is resolved */
	pSwitch->nOut = jx9VmInstrLength(pGen->pVm);
	GenStateFixJumps(pSwitchBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	if( pGen->pIn < pGen->pEnd ){
		/* Jump the trailing curly braces */
		pGen->pIn++;
	}
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}